

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

size_t mi_bitmap_mask_across
                 (mi_bitmap_index_t bitmap_idx,size_t bitmap_fields,size_t count,size_t *pre_mask,
                 size_t *mid_mask,size_t *post_mask)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  size_t *in_RCX;
  size_t in_RDX;
  mi_bitmap_index_t in_RDI;
  undefined8 *in_R8;
  size_t *in_R9;
  size_t mid_count;
  size_t pre_bits;
  size_t bitidx;
  undefined8 local_58;
  undefined8 local_8;
  
  sVar1 = mi_bitmap_index_bit_in_field(in_RDI);
  if (sVar1 + in_RDX < 0x41) {
    sVar1 = mi_bitmap_mask_(in_RDX,sVar1);
    *in_RCX = sVar1;
    *in_R8 = 0;
    *in_R9 = 0;
    local_8 = 0;
  }
  else {
    sVar2 = mi_bitmap_mask_(0x40 - sVar1,sVar1);
    *in_RCX = sVar2;
    uVar3 = in_RDX - (0x40 - sVar1);
    local_8 = uVar3 >> 6;
    *in_R8 = 0xffffffffffffffff;
    uVar3 = uVar3 & 0x3f;
    if (uVar3 == 0) {
      local_58 = 0;
    }
    else {
      local_58 = mi_bitmap_mask_(uVar3,0);
    }
    *in_R9 = local_58;
  }
  return local_8;
}

Assistant:

static size_t mi_bitmap_mask_across(mi_bitmap_index_t bitmap_idx, size_t bitmap_fields, size_t count, size_t* pre_mask, size_t* mid_mask, size_t* post_mask) {
  MI_UNUSED(bitmap_fields);
  const size_t bitidx = mi_bitmap_index_bit_in_field(bitmap_idx);
  if mi_likely(bitidx + count <= MI_BITMAP_FIELD_BITS) {
    *pre_mask = mi_bitmap_mask_(count, bitidx);
    *mid_mask = 0;
    *post_mask = 0;
    mi_assert_internal(mi_bitmap_index_field(bitmap_idx) < bitmap_fields);
    return 0;
  }